

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::~MLMG(MLMG *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->m_iter_fine_resnorm0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&this->m_niters_cg);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->timer);
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->rescor).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->cor_hold).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->cor).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->res).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&this->sol_is_alias);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::~vector
            (&(this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::~vector
            (&(this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            (&this->ns_rhs);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            (&this->ns_sol);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr(&this->ns_mlmg);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::~unique_ptr
            (&this->ns_linop);
  return;
}

Assistant:

MLMG::~MLMG ()
{}